

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPreviewSurface *shader,uint32_t indent)

{
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *pTVar1;
  TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *attr;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *pTVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *attr_00;
  TypedTerminalAttribute<tinyusdz::Token> *pTVar3;
  uint32_t indent_00;
  string local_648;
  allocator local_621;
  string local_620;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  string local_5b8;
  allocator local_591;
  string local_590;
  string local_570;
  allocator local_549;
  string local_548;
  string local_528;
  allocator local_501;
  string local_500;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  string local_498;
  allocator local_471;
  string local_470;
  string local_450;
  allocator local_429;
  string local_428;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  string local_3c0;
  allocator local_399;
  string local_398;
  string local_378;
  allocator local_351;
  string local_350;
  string local_330;
  allocator local_309;
  string local_308;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  UsdPreviewSurface *shader_local;
  
  local_1c = (uint32_t)shader;
  ptStack_18 = this;
  shader_local = (UsdPreviewSurface *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pTVar1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
           (ptStack_18 + 0x730);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"inputs:diffuseColor",&local_1e9);
  print_typed_attr<tinyusdz::value::color3f>(&local_1c8,pTVar1,&local_1e8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pTVar1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
           (ptStack_18 + 0x9c8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_230,"inputs:emissiveColor",&local_231);
  print_typed_attr<tinyusdz::value::color3f>(&local_210,pTVar1,&local_230,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  attr = (TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *)(ptStack_18 + 0xc60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_278,"inputs:useSpecularWorkflow",&local_279);
  print_typed_attr<int>(&local_258,attr,&local_278,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x20b0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c0,"inputs:ior",&local_2c1);
  print_typed_attr<float>(&local_2a0,pTVar2,&local_2c0,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pTVar1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
           (ptStack_18 + 0xee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_308,"inputs:specularColor",&local_309);
  print_typed_attr<tinyusdz::value::color3f>(&local_2e8,pTVar1,&local_308,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1180);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_350,"inputs:metallic",&local_351);
  print_typed_attr<float>(&local_330,pTVar2,&local_350,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_330);
  ::std::__cxx11::string::~string((string *)&local_330);
  ::std::__cxx11::string::~string((string *)&local_350);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1408);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_398,"inputs:clearcoat",&local_399);
  print_typed_attr<float>(&local_378,pTVar2,&local_398,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_378);
  ::std::__cxx11::string::~string((string *)&local_378);
  ::std::__cxx11::string::~string((string *)&local_398);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1690);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_3e0,"inputs:clearcoatRoughness",&local_3e1);
  print_typed_attr<float>(&local_3c0,pTVar2,&local_3e0,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1918);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_428,"inputs:roughness",&local_429);
  print_typed_attr<float>(&local_408,pTVar2,&local_428,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_408);
  ::std::__cxx11::string::~string((string *)&local_408);
  ::std::__cxx11::string::~string((string *)&local_428);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_429);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1ba0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_470,"inputs:opacity",&local_471);
  print_typed_attr<float>(&local_450,pTVar2,&local_470,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_450);
  ::std::__cxx11::string::~string((string *)&local_450);
  ::std::__cxx11::string::~string((string *)&local_470);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1e28);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_4b8,"inputs:opacityThreshold",&local_4b9);
  print_typed_attr<float>(&local_498,pTVar2,&local_4b8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_498);
  ::std::__cxx11::string::~string((string *)&local_498);
  ::std::__cxx11::string::~string((string *)&local_4b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  attr_00 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
            (ptStack_18 + 0x2338);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_500,"inputs:normal",&local_501);
  print_typed_attr<tinyusdz::value::normal3f>(&local_4e0,attr_00,&local_500,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_4e0);
  ::std::__cxx11::string::~string((string *)&local_4e0);
  ::std::__cxx11::string::~string((string *)&local_500);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_501);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x25d0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_548,"inputs:displacement",&local_549);
  print_typed_attr<float>(&local_528,pTVar2,&local_548,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_528);
  ::std::__cxx11::string::~string((string *)&local_528);
  ::std::__cxx11::string::~string((string *)&local_548);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_549);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x2858);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_590,"inputs:occlusion",&local_591);
  print_typed_attr<float>(&local_570,pTVar2,&local_590,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_570);
  ::std::__cxx11::string::~string((string *)&local_570);
  ::std::__cxx11::string::~string((string *)&local_590);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_591);
  pTVar3 = (TypedTerminalAttribute<tinyusdz::Token> *)(ptStack_18 + 0x2ae0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_5d8,"outputs:surface",&local_5d9);
  print_typed_terminal_attr<tinyusdz::Token>(&local_5b8,pTVar3,&local_5d8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_5b8);
  ::std::__cxx11::string::~string((string *)&local_5b8);
  ::std::__cxx11::string::~string((string *)&local_5d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  pTVar3 = (TypedTerminalAttribute<tinyusdz::Token> *)(ptStack_18 + 0x2d10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_620,"outputs:displacement",&local_621);
  indent_00 = local_1c;
  print_typed_terminal_attr<tinyusdz::Token>(&local_600,pTVar3,&local_620,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_600);
  ::std::__cxx11::string::~string((string *)&local_600);
  ::std::__cxx11::string::~string((string *)&local_620);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_621);
  print_common_shader_params_abi_cxx11_
            (&local_648,ptStack_18,(ShaderNode *)(ulong)local_1c,indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_648);
  ::std::__cxx11::string::~string((string *)&local_648);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_shader_params(const UsdPreviewSurface &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.diffuseColor, "inputs:diffuseColor", indent);
  ss << print_typed_attr(shader.emissiveColor, "inputs:emissiveColor", indent);
  ss << print_typed_attr(shader.useSpecularWorkflow,
                         "inputs:useSpecularWorkflow", indent);
  ss << print_typed_attr(shader.ior, "inputs:ior", indent);
  ss << print_typed_attr(shader.specularColor, "inputs:specularColor", indent);
  ss << print_typed_attr(shader.metallic, "inputs:metallic", indent);
  ss << print_typed_attr(shader.clearcoat, "inputs:clearcoat", indent);
  ss << print_typed_attr(shader.clearcoatRoughness, "inputs:clearcoatRoughness",
                         indent);
  ss << print_typed_attr(shader.roughness, "inputs:roughness", indent);
  ss << print_typed_attr(shader.opacity, "inputs:opacity", indent);
  ss << print_typed_attr(shader.opacityThreshold, "inputs:opacityThreshold",
                         indent);
  ss << print_typed_attr(shader.normal, "inputs:normal", indent);
  ss << print_typed_attr(shader.displacement, "inputs:displacement", indent);
  ss << print_typed_attr(shader.occlusion, "inputs:occlusion", indent);

  ss << print_typed_terminal_attr(shader.outputsSurface, "outputs:surface",
                                  indent);
  ss << print_typed_terminal_attr(shader.outputsDisplacement,
                                  "outputs:displacement", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}